

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_modifiers_test.h
# Opt level: O1

void __thiscall
phmap::priv::gtest_suite_ModifiersTest_::
Emplace<phmap::parallel_node_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_phmap::NullMutex>_>
::TestBody(Emplace<phmap::parallel_node_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_phmap::NullMutex>_>
           *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  mt19937_64 *__urng;
  pointer *__ptr;
  long lVar3;
  char *pcVar4;
  tuple<const_phmap::priv::hash_internal::EnumClass_&> *args_1;
  Message *args_1_00;
  pair<const_phmap::priv::hash_internal::EnumClass,_int> pVar5;
  AssertionResult gtest_ar_;
  T val2;
  AssertionResult gtest_ar;
  pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>::iterator,_bool>
  p;
  TypeParam m;
  AssertHelper local_540;
  Message local_538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_530;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_528;
  result_type_conflict1 local_520 [2];
  undefined1 local_518 [8];
  _Head_base<0UL,_const_int_&,_false> _Stack_510;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_508;
  ctrl_t *local_4f8;
  anon_union_8_1_a8a14541_for_iterator_1 aStack_4f0;
  bool local_4e8;
  AssertHelper local_4e0;
  undefined1 local_4d8 [16];
  undefined1 local_4c8 [40];
  anon_union_8_1_a8a14541_for_iterator_1 aStack_4a0;
  bool local_498 [8];
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  local_490;
  
  pVar5 = hash_internal::
          Generator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_void>::operator()
                    ((Generator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_void> *
                     )&local_490);
  local_4d8._0_8_ = pVar5.first;
  _Stack_510._M_head_impl = (int *)(local_4d8 + 8);
  local_4d8._8_4_ = pVar5.second;
  lVar3 = 0x40;
  do {
    *(undefined8 *)(local_4c8 + lVar3 + 8) = 0;
    *(undefined8 *)(local_4c8 + lVar3 + 0x10) = 0;
    *(undefined8 *)(local_4d8 + lVar3 + 8) = 0;
    *(undefined8 *)(local_4c8 + lVar3) = 0;
    *(undefined8 *)(local_4c8 + lVar3 + 0x20) = 0;
    *(long *)(local_498 + lVar3 + -8) =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
         next_id<phmap::priv::StatefulTestingEqual>()::gId;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
    next_id<phmap::priv::StatefulTestingEqual>()::gId =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
         next_id<phmap::priv::StatefulTestingEqual>()::gId + 1;
    *(long *)(local_498 + lVar3) =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
         next_id<phmap::priv::StatefulTestingHash>()::gId;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
    next_id<phmap::priv::StatefulTestingHash>()::gId =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
         next_id<phmap::priv::StatefulTestingHash>()::gId + 1;
    *(undefined8 *)((long)&local_490.sets_._M_elems[0].set_.ctrl_ + lVar3) = 0;
    lVar3 = lVar3 + 0x48;
  } while (lVar3 != 0x4c0);
  local_518 = (undefined1  [8])local_4d8;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_4d8._0_8_;
  args_1 = (tuple<const_phmap::priv::hash_internal::EnumClass_&> *)local_518;
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>>
  ::
  emplace_decomposable_with_hash<phmap::priv::hash_internal::EnumClass,std::piecewise_construct_t_const&,std::tuple<phmap::priv::hash_internal::EnumClass_const&>,std::tuple<int_const&>>
            ((pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>::iterator,_bool>
              *)local_4c8,
             (parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>>
              *)&local_490,(EnumClass *)local_518,
             SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),8) +
             SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),0),
             (piecewise_construct_t *)&std::piecewise_construct,args_1,
             (tuple<const_int_&> *)&_Stack_510);
  local_538.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ = local_498[0];
  local_530 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_498[0] == false) {
    testing::Message::Message((Message *)&local_528);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_518,(internal *)&local_538,(AssertionResult *)"p.second","false",
               "true",(char *)args_1);
    testing::internal::AssertHelper::AssertHelper
              (&local_540,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x88,(char *)local_518);
    testing::internal::AssertHelper::operator=(&local_540,(Message *)&local_528);
    testing::internal::AssertHelper::~AssertHelper(&local_540);
    if (local_518 != (undefined1  [8])&local_508) {
      operator_delete((void *)local_518,(ulong)(local_508._M_allocated_capacity + 1));
    }
    if (local_528._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_528._M_head_impl + 8))();
    }
  }
  if (local_530 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_530,local_530);
  }
  testing::internal::
  CmpHelperEQ<std::pair<phmap::priv::hash_internal::EnumClass_const,int>,std::pair<phmap::priv::hash_internal::EnumClass_const,int>>
            ((internal *)local_518,"val","*p.first",
             (pair<const_phmap::priv::hash_internal::EnumClass,_int> *)local_4d8,
             *(pair<const_phmap::priv::hash_internal::EnumClass,_int> **)local_4c8._24_8_);
  if (local_518[0] == (internal)0x0) {
    testing::Message::Message(&local_538);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_510._M_head_impl
        == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)_Stack_510._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_528,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x89,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_528,&local_538);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_528);
    if (local_538.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_538.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_510._M_head_impl
      != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_510,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_510._M_head_impl);
  }
  local_518 = (undefined1  [8])0x7fffffff00000000;
  __urng = hash_internal::GetSharedRng();
  local_520[0] = std::uniform_int_distribution<int>::operator()
                           ((uniform_int_distribution<int> *)local_518,__urng,
                            (param_type *)local_518);
  local_530 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_520;
  local_528._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4d8._0_8_;
  local_538.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )&local_528;
  args_1_00 = &local_538;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_4d8._0_8_;
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>>
  ::
  emplace_decomposable_with_hash<phmap::priv::hash_internal::EnumClass,std::piecewise_construct_t_const&,std::tuple<phmap::priv::hash_internal::EnumClass_const&>,std::tuple<int_const&>>
            ((pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>::iterator,_bool>
              *)local_518,
             (parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>>
              *)&local_490,
             (EnumClass *)
             local_538.ss_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,
             SUB168(auVar2 * ZEXT816(0xde5fb9d2630458e9),8) +
             SUB168(auVar2 * ZEXT816(0xde5fb9d2630458e9),0),
             (piecewise_construct_t *)&std::piecewise_construct,
             (tuple<const_phmap::priv::hash_internal::EnumClass_&> *)args_1_00,
             (tuple<const_int_&> *)&local_530);
  local_4c8._0_8_ = local_518;
  local_4c8._8_8_ = _Stack_510._M_head_impl;
  local_4c8._16_8_ = local_508._M_allocated_capacity;
  local_4c8._24_8_ = local_508._8_8_;
  local_4c8._32_8_ = local_4f8;
  aStack_4a0 = aStack_4f0;
  local_498[0] = local_4e8;
  local_538.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(CONCAT71(local_538.ss_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl._1_7_,local_4e8) ^ 1);
  local_530 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_4e8 != false) {
    testing::Message::Message((Message *)&local_540);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_518,(internal *)&local_538,(AssertionResult *)"p.second","true",
               "false",(char *)args_1_00);
    testing::internal::AssertHelper::AssertHelper
              (&local_4e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x8c,(char *)local_518);
    testing::internal::AssertHelper::operator=(&local_4e0,(Message *)&local_540);
    testing::internal::AssertHelper::~AssertHelper(&local_4e0);
    if (local_518 != (undefined1  [8])&local_508) {
      operator_delete((void *)local_518,(ulong)(local_508._M_allocated_capacity + 1));
    }
    if (local_540.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_540.data_ + 8))();
    }
  }
  if (local_530 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_530,local_530);
  }
  testing::internal::
  CmpHelperEQ<std::pair<phmap::priv::hash_internal::EnumClass_const,int>,std::pair<phmap::priv::hash_internal::EnumClass_const,int>>
            ((internal *)local_518,"val","*p.first",
             (pair<const_phmap::priv::hash_internal::EnumClass,_int> *)local_4d8,
             *(pair<const_phmap::priv::hash_internal::EnumClass,_int> **)local_4c8._24_8_);
  if (local_518[0] == (internal)0x0) {
    testing::Message::Message(&local_538);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_510._M_head_impl
        == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)_Stack_510._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_540,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x8d,pcVar4);
    testing::internal::AssertHelper::operator=(&local_540,&local_538);
    testing::internal::AssertHelper::~AssertHelper(&local_540);
    if (local_538.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_538.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_510._M_head_impl
      != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_510,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_510._M_head_impl);
  }
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  ::~parallel_hash_set(&local_490);
  return;
}

Assistant:

TYPED_TEST_P(ModifiersTest, Emplace) {
  using T = hash_internal::GeneratedType<TypeParam>;
  using V = typename TypeParam::mapped_type;
  T val = hash_internal::Generator<T>()();
  TypeParam m;
  // TODO(alkis): We need a way to run emplace in a more meaningful way. Perhaps
  // with test traits/policy.
  auto p = m.emplace(val);
  EXPECT_TRUE(p.second);
  EXPECT_EQ(val, *p.first);
  T val2 = {val.first, hash_internal::Generator<V>()()};
  p = m.emplace(val2);
  EXPECT_FALSE(p.second);
  EXPECT_EQ(val, *p.first);
}